

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O1

UBool __thiscall icu_63::AnnualTimeZoneRule::operator==(AnnualTimeZoneRule *this,TimeZoneRule *that)

{
  char *__s1;
  char *__s2;
  UBool UVar1;
  int iVar2;
  
  if (this == (AnnualTimeZoneRule *)that) {
    return '\x01';
  }
  __s1 = *(char **)((this->super_TimeZoneRule).super_UObject._vptr_UObject[-1] + 8);
  __s2 = *(char **)((that->super_UObject)._vptr_UObject[-1] + 8);
  if ((((__s1 == __s2) || ((*__s1 != '*' && (iVar2 = strcmp(__s1,__s2), iVar2 == 0)))) &&
      (UVar1 = DateTimeRule::operator==
                         (this->fDateTimeRule,(DateTimeRule *)that[1].super_UObject._vptr_UObject),
      UVar1 != '\0')) &&
     (this->fStartYear == *(int *)&that[1].fName.super_Replaceable.super_UObject._vptr_UObject)) {
    return this->fEndYear ==
           *(int *)((long)&that[1].fName.super_Replaceable.super_UObject._vptr_UObject + 4);
  }
  return '\0';
}

Assistant:

UBool
AnnualTimeZoneRule::operator==(const TimeZoneRule& that) const {
    if (this == &that) {
        return TRUE;
    }
    if (typeid(*this) != typeid(that)) {
        return FALSE;
    }
    AnnualTimeZoneRule *atzr = (AnnualTimeZoneRule*)&that;
    return (*fDateTimeRule == *(atzr->fDateTimeRule) &&
            fStartYear == atzr->fStartYear &&
            fEndYear == atzr->fEndYear);
}